

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O2

rfc5444_result cb_start_packet(rfc5444_reader_tlvblock_context *c)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = c->consumer->order;
  printf("%s: packet start (order %d): %d\n","cb_start_packet",(ulong)uVar1,
         (ulong)(uint)callback_index);
  iVar2 = callback_index + 1;
  (&callback_index)[(int)uVar1] = callback_index;
  callback_index = iVar2;
  return idxcb_start_packet[(long)(int)uVar1 + 1];
}

Assistant:

static enum rfc5444_result
cb_start_packet(struct rfc5444_reader_tlvblock_context *c) {
  int oi = c->consumer->order - 1;

#ifdef PRINT_CB
  printf("%s: packet start (order %d): %d\n", __func__, c->consumer->order, callback_index);
#endif
  idxcb_start_packet[oi] = callback_index++;
  return result_start_packet[oi];
}